

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

void setMonitoredItemSettings
               (UA_Server *server,UA_MonitoredItem *mon,UA_MonitoringMode monitoringMode,
               UA_MonitoringParameters *params)

{
  uint uVar1;
  UA_DataChangeTrigger UVar2;
  UA_NodeStoreEntry **ppUVar3;
  uint uVar4;
  double dVar5;
  double dVar6;
  
  if (mon->sampleJobIsRegistered == true) {
    mon->sampleJobIsRegistered = false;
    UA_Server_removeRepeatedJob(server,mon->sampleJobGuid);
  }
  mon->monitoringMode = monitoringMode;
  mon->clientHandle = params->clientHandle;
  if (mon->attributeID == 0xc) {
    dVar6 = 10000.0;
  }
  else {
    dVar6 = params->samplingInterval;
    if ((((mon->attributeID == 0xd) &&
         (ppUVar3 = findNode(server->nodestore,&mon->monitoredNodeId),
         ppUVar3 != (UA_NodeStoreEntry **)0x0)) &&
        (((*ppUVar3)->node).nodeClass == UA_NODECLASS_VARIABLE)) &&
       (dVar5 = *(double *)&(*ppUVar3)[2].node.nodeClass, dVar6 < dVar5)) {
      dVar6 = dVar5;
    }
  }
  dVar5 = (server->config).samplingIntervalLimits.max;
  if ((dVar6 <= dVar5) && (dVar5 = (server->config).samplingIntervalLimits.min, dVar5 <= dVar6)) {
    dVar5 = dVar6;
  }
  mon->samplingInterval = dVar5;
  if (NAN(dVar6)) {
    mon->samplingInterval = (server->config).samplingIntervalLimits.min;
  }
  UVar2 = UA_DATACHANGETRIGGER_STATUSVALUE;
  if (((params->filter).encoding == UA_EXTENSIONOBJECT_DECODED) &&
     ((params->filter).content.decoded.type == (UA_DataType *)0x13fdf0)) {
    UVar2 = *(params->filter).content.decoded.data;
  }
  mon->trigger = UVar2;
  uVar1 = params->queueSize;
  uVar4 = (server->config).queueSizeLimits.max;
  if ((uVar4 < uVar1) || (uVar4 = (server->config).queueSizeLimits.min, uVar1 < uVar4)) {
    mon->maxQueueSize = uVar4;
  }
  else {
    mon->maxQueueSize = uVar1;
  }
  mon->discardOldest = params->discardOldest;
  if (monitoringMode != UA_MONITORINGMODE_REPORTING) {
    return;
  }
  MonitoredItem_registerSampleJob(server,mon);
  return;
}

Assistant:

static void
setMonitoredItemSettings(UA_Server *server, UA_MonitoredItem *mon,
                         UA_MonitoringMode monitoringMode,
                         const UA_MonitoringParameters *params) {
    MonitoredItem_unregisterSampleJob(server, mon);
    mon->monitoringMode = monitoringMode;

    /* ClientHandle */
    mon->clientHandle = params->clientHandle;

    /* SamplingInterval */
    UA_Double samplingInterval = params->samplingInterval;
    if(mon->attributeID == UA_ATTRIBUTEID_VALUE) {
        const UA_VariableNode *vn = (const UA_VariableNode*)
            UA_NodeStore_get(server->nodestore, &mon->monitoredNodeId);
        if(vn && vn->nodeClass == UA_NODECLASS_VARIABLE &&
           samplingInterval <  vn->minimumSamplingInterval)
            samplingInterval = vn->minimumSamplingInterval;
    } else if(mon->attributeID == UA_ATTRIBUTEID_EVENTNOTIFIER) {
        /* TODO: events should not need a samplinginterval */
        samplingInterval = 10000.0f; // 10 seconds to reduce the load
    }
    mon->samplingInterval = samplingInterval;
    UA_BOUNDEDVALUE_SETWBOUNDS(server->config.samplingIntervalLimits,
        samplingInterval, mon->samplingInterval);
    if(samplingInterval != samplingInterval) /* Check for nan */
        mon->samplingInterval = server->config.samplingIntervalLimits.min;

    /* Filter */
    if(params->filter.encoding != UA_EXTENSIONOBJECT_DECODED ||
       params->filter.content.decoded.type != &UA_TYPES[UA_TYPES_DATACHANGEFILTER]) {
        /* Default: Trigger only on the value and the statuscode */
        mon->trigger = UA_DATACHANGETRIGGER_STATUSVALUE;
    } else {
        UA_DataChangeFilter *filter = params->filter.content.decoded.data;
        mon->trigger = filter->trigger;
    }

    /* QueueSize */
    UA_BOUNDEDVALUE_SETWBOUNDS(server->config.queueSizeLimits,
                               params->queueSize, mon->maxQueueSize);

    /* DiscardOldest */
    mon->discardOldest = params->discardOldest;

    /* Register sample job if reporting is enabled */
    if(monitoringMode == UA_MONITORINGMODE_REPORTING)
        MonitoredItem_registerSampleJob(server, mon);
}